

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvtBroadphase.cpp
# Opt level: O3

void __thiscall btDbvtBroadphase::collide(btDbvtBroadphase *this,btDispatcher *dispatcher)

{
  uint uVar1;
  btDbvtProxy *pbVar2;
  btDbvtProxy *pbVar3;
  float *pfVar4;
  float *pfVar5;
  byte bVar6;
  int iVar7;
  btDbvtNode *pbVar8;
  long lVar9;
  long lVar10;
  btDbvtProxy **ppbVar11;
  int iVar12;
  int iVar13;
  undefined1 *this_00;
  btDbvtProxy *data;
  btScalar bVar14;
  btDbvtVolume curAabb;
  undefined1 local_58 [16];
  btScalar local_48 [2];
  btScalar abStack_40 [4];
  undefined4 extraout_var;
  
  this_00 = &this->field_0x8;
  btDbvt::optimizeIncremental
            ((btDbvt *)this_00,(this->m_dupdates * *(int *)&this->field_0x1c) / 100 + 1);
  if (this->m_fixedleft != 0) {
    iVar12 = (this->m_fupdates * *(int *)&this->field_0x7c) / 100 + 1;
    btDbvt::optimizeIncremental((btDbvt *)&this->field_0x68,iVar12);
    iVar12 = this->m_fixedleft - iVar12;
    iVar7 = 0;
    if (0 < iVar12) {
      iVar7 = iVar12;
    }
    this->m_fixedleft = iVar7;
  }
  iVar7 = this->m_stageCurrent;
  iVar7 = (iVar7 - ((iVar7 - (iVar7 + 1 >> 0x1f)) + 1U & 0xfffffffe)) + 1;
  this->m_stageCurrent = iVar7;
  if (this->m_stageRoots[iVar7] != (btDbvtProxy *)0x0) {
    data = this->m_stageRoots[iVar7];
    do {
      pbVar2 = data->links[1];
      ppbVar11 = data->links[0]->links + 1;
      if (data->links[0] == (btDbvtProxy *)0x0) {
        ppbVar11 = this->m_stageRoots + data->stage;
      }
      *ppbVar11 = pbVar2;
      if (pbVar2 != (btDbvtProxy *)0x0) {
        pbVar2->links[0] = data->links[0];
      }
      data->links[0] = (btDbvtProxy *)0x0;
      pbVar3 = this->m_stageRoots[2];
      data->links[1] = pbVar3;
      if (pbVar3 != (btDbvtProxy *)0x0) {
        pbVar3->links[0] = data;
      }
      this->m_stageRoots[2] = data;
      btDbvt::remove((btDbvt *)this_00,(char *)data->leaf);
      local_58._0_8_ = *(undefined8 *)(data->super_btBroadphaseProxy).m_aabbMin.m_floats;
      local_58._8_8_ = *(undefined8 *)((data->super_btBroadphaseProxy).m_aabbMin.m_floats + 2);
      local_48 = *(btScalar (*) [2])(data->super_btBroadphaseProxy).m_aabbMax.m_floats;
      abStack_40._0_8_ = *(undefined8 *)((data->super_btBroadphaseProxy).m_aabbMax.m_floats + 2);
      pbVar8 = btDbvt::insert((btDbvt *)&this->field_0x68,(btDbvtVolume *)local_58,data);
      data->leaf = pbVar8;
      data->stage = 2;
      data = pbVar2;
    } while (pbVar2 != (btDbvtProxy *)0x0);
    this->m_fixedleft = *(int *)&this->field_0x7c;
    this->m_needcleanup = true;
  }
  local_58._0_8_ = &PTR__ICollide_0021b108;
  bVar6 = this->m_deferedcollide;
  local_58._8_8_ = this;
  if ((bool)bVar6 == true) {
    btDbvt::collideTTpersistentStack
              ((btDbvt *)this_00,*(btDbvtNode **)&this->field_0x8,*(btDbvtNode **)&this->field_0x68,
               (ICollide *)local_58);
    bVar6 = this->m_deferedcollide;
  }
  if ((bVar6 & 1) != 0) {
    btDbvt::collideTTpersistentStack
              ((btDbvt *)this_00,*(btDbvtNode **)this_00,*(btDbvtNode **)this_00,
               (ICollide *)local_58);
  }
  if (this->m_needcleanup == true) {
    iVar7 = (*(this->m_paircache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
              [7])();
    lVar9 = CONCAT44(extraout_var,iVar7);
    iVar7 = *(int *)(lVar9 + 4);
    if (0 < iVar7) {
      iVar12 = (this->m_cupdates * iVar7) / 100;
      if (iVar12 < this->m_newpairs) {
        iVar12 = this->m_newpairs;
      }
      iVar13 = iVar12;
      if (iVar7 < iVar12) {
        iVar13 = iVar7;
      }
      if (0 < iVar12) {
        iVar7 = 0;
        do {
          lVar10 = (long)((this->m_cid + iVar7) % *(int *)(lVar9 + 4)) * 0x20;
          pfVar4 = *(float **)(*(long *)(*(long *)(lVar9 + 0x10) + lVar10) + 0x40);
          pfVar5 = *(float **)(*(long *)(*(long *)(lVar9 + 0x10) + 8 + lVar10) + 0x40);
          if ((((pfVar5[4] < *pfVar4) || (pfVar4[4] < *pfVar5)) || (pfVar5[5] < pfVar4[1])) ||
             (((pfVar4[5] < pfVar5[1] || (pfVar5[6] < pfVar4[2])) || (pfVar4[6] < pfVar5[2])))) {
            (*(this->m_paircache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
              [3])();
            iVar13 = iVar13 + -1;
            iVar7 = iVar7 + -1;
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 < iVar13);
        iVar7 = *(int *)(lVar9 + 4);
        if (iVar7 < 1) {
          this->m_cid = 0;
          goto LAB_001357df;
        }
      }
      this->m_cid = (iVar13 + this->m_cid) % iVar7;
    }
  }
LAB_001357df:
  this->m_pid = this->m_pid + 1;
  this->m_newpairs = 1;
  this->m_needcleanup = false;
  uVar1 = this->m_updates_call;
  bVar14 = 0.0;
  if (uVar1 != 0) {
    bVar14 = (float)this->m_updates_done / (float)uVar1;
  }
  this->m_updates_ratio = bVar14;
  this->m_updates_done = this->m_updates_done >> 1;
  this->m_updates_call = uVar1 >> 1;
  return;
}

Assistant:

void							btDbvtBroadphase::collide(btDispatcher* dispatcher)
{
	/*printf("---------------------------------------------------------\n");
	printf("m_sets[0].m_leaves=%d\n",m_sets[0].m_leaves);
	printf("m_sets[1].m_leaves=%d\n",m_sets[1].m_leaves);
	printf("numPairs = %d\n",getOverlappingPairCache()->getNumOverlappingPairs());
	{
		int i;
		for (i=0;i<getOverlappingPairCache()->getNumOverlappingPairs();i++)
		{
			printf("pair[%d]=(%d,%d),",i,getOverlappingPairCache()->getOverlappingPairArray()[i].m_pProxy0->getUid(),
				getOverlappingPairCache()->getOverlappingPairArray()[i].m_pProxy1->getUid());
		}
		printf("\n");
	}
*/



	SPC(m_profiling.m_total);
	/* optimize				*/ 
	m_sets[0].optimizeIncremental(1+(m_sets[0].m_leaves*m_dupdates)/100);
	if(m_fixedleft)
	{
		const int count=1+(m_sets[1].m_leaves*m_fupdates)/100;
		m_sets[1].optimizeIncremental(1+(m_sets[1].m_leaves*m_fupdates)/100);
		m_fixedleft=btMax<int>(0,m_fixedleft-count);
	}
	/* dynamic -> fixed set	*/ 
	m_stageCurrent=(m_stageCurrent+1)%STAGECOUNT;
	btDbvtProxy*	current=m_stageRoots[m_stageCurrent];
	if(current)
	{
		btDbvtTreeCollider	collider(this);
		do	{
			btDbvtProxy*	next=current->links[1];
			listremove(current,m_stageRoots[current->stage]);
			listappend(current,m_stageRoots[STAGECOUNT]);
#if DBVT_BP_ACCURATESLEEPING
			m_paircache->removeOverlappingPairsContainingProxy(current,dispatcher);
			collider.proxy=current;
			btDbvt::collideTV(m_sets[0].m_root,current->aabb,collider);
			btDbvt::collideTV(m_sets[1].m_root,current->aabb,collider);
#endif
			m_sets[0].remove(current->leaf);
			ATTRIBUTE_ALIGNED16(btDbvtVolume)	curAabb=btDbvtVolume::FromMM(current->m_aabbMin,current->m_aabbMax);
			current->leaf	=	m_sets[1].insert(curAabb,current);
			current->stage	=	STAGECOUNT;	
			current			=	next;
		} while(current);
		m_fixedleft=m_sets[1].m_leaves;
		m_needcleanup=true;
	}
	/* collide dynamics		*/ 
	{
		btDbvtTreeCollider	collider(this);
		if(m_deferedcollide)
		{
			SPC(m_profiling.m_fdcollide);
			m_sets[0].collideTTpersistentStack(m_sets[0].m_root,m_sets[1].m_root,collider);
		}
		if(m_deferedcollide)
		{
			SPC(m_profiling.m_ddcollide);
			m_sets[0].collideTTpersistentStack(m_sets[0].m_root,m_sets[0].m_root,collider);
		}
	}
	/* clean up				*/ 
	if(m_needcleanup)
	{
		SPC(m_profiling.m_cleanup);
		btBroadphasePairArray&	pairs=m_paircache->getOverlappingPairArray();
		if(pairs.size()>0)
		{

			int			ni=btMin(pairs.size(),btMax<int>(m_newpairs,(pairs.size()*m_cupdates)/100));
			for(int i=0;i<ni;++i)
			{
				btBroadphasePair&	p=pairs[(m_cid+i)%pairs.size()];
				btDbvtProxy*		pa=(btDbvtProxy*)p.m_pProxy0;
				btDbvtProxy*		pb=(btDbvtProxy*)p.m_pProxy1;
				if(!Intersect(pa->leaf->volume,pb->leaf->volume))
				{
#if DBVT_BP_SORTPAIRS
					if(pa->m_uniqueId>pb->m_uniqueId) 
						btSwap(pa,pb);
#endif
					m_paircache->removeOverlappingPair(pa,pb,dispatcher);
					--ni;--i;
				}
			}
			if(pairs.size()>0) m_cid=(m_cid+ni)%pairs.size(); else m_cid=0;
		}
	}
	++m_pid;
	m_newpairs=1;
	m_needcleanup=false;
	if(m_updates_call>0)
	{ m_updates_ratio=m_updates_done/(btScalar)m_updates_call; }
	else
	{ m_updates_ratio=0; }
	m_updates_done/=2;
	m_updates_call/=2;
}